

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadratureMouse.hpp
# Opt level: O1

void __thiscall Inputs::QuadratureMouse::prepare_step(QuadratureMouse *this)

{
  int iVar1;
  int axis;
  long lVar2;
  uint uVar3;
  
  lVar2 = 0;
  do {
    iVar1 = this->axes_[lVar2].super___atomic_base<int>._M_i;
    if (iVar1 != 0) {
      uVar3 = this->primaries_[lVar2] ^ 1;
      this->primaries_[lVar2] = uVar3;
      this->secondaries_[lVar2] = (uint)lVar2 ^ uVar3;
      if (iVar1 < 1) {
        LOCK();
        this->axes_[lVar2].super___atomic_base<int>._M_i =
             this->axes_[lVar2].super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      else {
        LOCK();
        this->axes_[lVar2].super___atomic_base<int>._M_i =
             this->axes_[lVar2].super___atomic_base<int>._M_i + -1;
        UNLOCK();
        *(byte *)(this->secondaries_ + lVar2) = (byte)this->secondaries_[lVar2] ^ 1;
      }
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  return;
}

Assistant:

void prepare_step() {
			for(int axis = 0; axis < 2; ++axis) {
				// Do nothing if there's no motion to communicate.
				const int axis_value = axes_[axis];
				if(!axis_value) continue;

				// Toggle the primary channel and set the secondary for
				// negative motion. At present the y axis signals the
				// secondary channel the opposite way around from the
				// primary.
				primaries_[axis] ^= 1;
				secondaries_[axis] = primaries_[axis] ^ axis;
				if(axis_value > 0) {
					-- axes_[axis];
					secondaries_[axis] ^= 1;	// Switch to positive motion.
				} else {
					++ axes_[axis];
				}
			}
		}